

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyDropComments(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (next = pNVar1, next != (Node *)0x0) {
    pNVar1 = next->next;
    if (next->type == CommentTag) {
      prvTidyRemoveNode(next);
      prvTidyFreeNode(doc,next);
    }
    else if (next->content != (Node *)0x0) {
      prvTidyDropComments(doc,next->content);
    }
  }
  return;
}

Assistant:

void TY_(DropComments)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->type == CommentTag)
        {
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;
            continue;
        }

        if (node->content)
            TY_(DropComments)(doc, node->content);

        node = next;
    }
}